

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O1

vector<const_char_*,_std::allocator<const_char_*>_> *
sf::priv::VulkanImplX11::getGraphicsRequiredInstanceExtensions(void)

{
  char *local_8;
  
  if (getGraphicsRequiredInstanceExtensions()::extensions == '\0') {
    getGraphicsRequiredInstanceExtensions();
  }
  if (getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_8 = "VK_KHR_surface";
    if (getGraphicsRequiredInstanceExtensions::extensions.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        getGraphicsRequiredInstanceExtensions::extensions.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)
                 &getGraphicsRequiredInstanceExtensions::extensions,
                 (iterator)
                 getGraphicsRequiredInstanceExtensions::extensions.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_8);
    }
    else {
      *getGraphicsRequiredInstanceExtensions::extensions.
       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = "VK_KHR_surface";
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getGraphicsRequiredInstanceExtensions::extensions.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_8 = "VK_KHR_xlib_surface";
    if (getGraphicsRequiredInstanceExtensions::extensions.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        getGraphicsRequiredInstanceExtensions::extensions.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)
                 &getGraphicsRequiredInstanceExtensions::extensions,
                 (iterator)
                 getGraphicsRequiredInstanceExtensions::extensions.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_8);
    }
    else {
      *getGraphicsRequiredInstanceExtensions::extensions.
       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = "VK_KHR_xlib_surface";
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getGraphicsRequiredInstanceExtensions::extensions.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  return &getGraphicsRequiredInstanceExtensions::extensions;
}

Assistant:

const std::vector<const char*>& VulkanImplX11::getGraphicsRequiredInstanceExtensions()
{
    static std::vector<const char*> extensions;

    if (extensions.empty())
    {
        extensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);
        extensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
    }

    return extensions;
}